

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsDiurnal_FSA_kry.c
# Opt level: O1

int main(int argc,char **argv)

{
  undefined1 auVar1 [16];
  double dVar2;
  double dVar3;
  UserData paVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  sunrealtype **ppsVar9;
  sunindextype *psVar10;
  sunrealtype *psVar11;
  N_Vector y;
  undefined1 (*pauVar12) [16];
  undefined8 *puVar13;
  void *__ptr;
  N_Vector *uS;
  char *pcVar14;
  undefined1 (*pauVar15) [16];
  sunindextype *(*papsVar16) [15];
  int unaff_EBP;
  char *__format;
  undefined4 unaff_R12D;
  int iVar17;
  long lVar18;
  long lVar19;
  double dVar20;
  void *cvode_mem;
  SUNContext sunctx;
  sunrealtype t;
  void *local_90;
  int local_84;
  double local_80;
  int local_74;
  undefined8 local_70;
  undefined8 *local_68;
  UserData local_60;
  double local_58;
  int local_4c;
  char *local_48;
  long local_40;
  sunrealtype local_38;
  
  local_90 = (void *)0x0;
  if (argc < 2) goto LAB_001026f5;
  pcVar14 = argv[1];
  local_84 = strcmp(pcVar14,"-nosensi");
  unaff_R12D = 0x104271;
  iVar17 = 0;
  local_48 = " PARTIAL ERROR CONTROL )";
  if (local_84 == 0) {
    unaff_R12D = 0xffffffff;
    iVar5 = 0;
  }
  else {
    iVar5 = strcmp(pcVar14,"-sensi");
    if ((iVar5 == 0) && (argc == 4)) {
      pcVar14 = argv[2];
      iVar6 = strcmp(pcVar14,"sim");
      unaff_EBP = 1;
      iVar5 = 1;
      unaff_R12D = 1;
      if (iVar6 != 0) {
        iVar6 = strcmp(pcVar14,"stg");
        if (iVar6 == 0) {
          unaff_R12D = 2;
        }
        else {
          iVar6 = strcmp(pcVar14,"stg1");
          unaff_R12D = 3;
          if (iVar6 != 0) goto LAB_001026f5;
        }
      }
      pcVar14 = argv[3];
      iVar7 = strcmp(pcVar14,"t");
      iVar6 = 1;
      if (iVar7 != 0) {
        iVar6 = strcmp(pcVar14,"f");
        if (iVar6 == 0) goto LAB_0010270f;
        goto LAB_001026f5;
      }
    }
    else {
LAB_001026f5:
      WrongArgs(*argv);
      iVar6 = unaff_EBP;
    }
    iVar5 = iVar6;
    local_48 = " FULL ERROR CONTROL )";
    iVar17 = 1;
  }
LAB_0010270f:
  local_60 = (UserData)malloc(0x1558);
  papsVar16 = local_60->pivot;
  lVar18 = 0;
  do {
    lVar19 = 0;
    do {
      ppsVar9 = (sunrealtype **)SUNDlsMat_newDenseMat(2,2);
      (*(sunrealtype **(*) [15])(papsVar16 + -0x1e))[lVar19] = ppsVar9;
      ppsVar9 = (sunrealtype **)SUNDlsMat_newDenseMat(2,2);
      (*(sunrealtype **(*) [15])(papsVar16 + -0xf))[lVar19] = ppsVar9;
      psVar10 = (sunindextype *)SUNDlsMat_newIndexArray(2);
      (*papsVar16)[lVar19] = psVar10;
      lVar19 = lVar19 + 1;
    } while (lVar19 != 0xf);
    lVar18 = lVar18 + 1;
    papsVar16 = papsVar16 + 1;
  } while (lVar18 != 0xf);
  psVar11 = (sunrealtype *)malloc(0x40);
  paVar4 = local_60;
  local_60->p = psVar11;
  local_60->om = 7.272205216643056e-05;
  local_60->dx = 1.4285714285714286;
  local_60->dz = 1.4285714285714286;
  local_60->hdco = 1.96e-06;
  local_60->haco = 0.00035;
  local_60->vdco = 4.9e-09;
  *psVar11 = 1.63e-16;
  psVar11[1] = 4.66e-16;
  psVar11[2] = 3.7e+16;
  psVar11[3] = 22.62;
  psVar11[4] = 7.601;
  psVar11[5] = 4e-06;
  *(undefined4 *)(psVar11 + 6) = 0xd2f1a9fc;
  *(undefined4 *)((long)psVar11 + 0x34) = 0x3f50624d;
  *(undefined4 *)(psVar11 + 7) = 0xe2308c3a;
  *(undefined4 *)((long)psVar11 + 0x3c) = 0x3e45798e;
  uVar8 = SUNContext_Create(0,&local_70);
  if ((int)uVar8 < 0) {
    pcVar14 = "SUNContext_Create";
  }
  else {
    y = (N_Vector)N_VNew_Serial(0x1c2);
    if (y == (N_Vector)0x0) {
      main_cold_6();
      return 1;
    }
    local_58 = paVar4->dx;
    local_80 = paVar4->dz;
    pauVar12 = (undefined1 (*) [16])N_VGetArrayPointer(y);
    lVar18 = 0;
    do {
      dVar20 = ((double)(int)lVar18 * local_80 + 30.0 + -40.0) * 0.1;
      dVar20 = dVar20 * dVar20;
      dVar20 = dVar20 * dVar20 * 0.5 + (1.0 - dVar20);
      lVar19 = 0;
      pauVar15 = pauVar12;
      do {
        dVar2 = ((double)(int)lVar19 * local_58 + 0.0 + -10.0) * 0.1;
        dVar2 = dVar2 * dVar2;
        dVar2 = dVar2 * dVar2 * 0.5 + (1.0 - dVar2);
        dVar3 = dVar2 * 1000000000000.0 * dVar20;
        auVar1._8_4_ = SUB84(dVar3,0);
        auVar1._0_8_ = dVar2 * 1000000.0 * dVar20;
        auVar1._12_4_ = (int)((ulong)dVar3 >> 0x20);
        *pauVar15 = auVar1;
        lVar19 = lVar19 + 1;
        pauVar15 = pauVar15 + 1;
      } while (lVar19 != 0xf);
      lVar18 = lVar18 + 1;
      pauVar12 = pauVar12 + 0xf;
    } while (lVar18 != 0xf);
    local_90 = (void *)CVodeCreate(2,local_70);
    if (local_90 == (void *)0x0) {
      main_cold_5();
      return 1;
    }
    uVar8 = CVodeSetUserData(local_90,paVar4);
    if ((int)uVar8 < 0) {
      pcVar14 = "CVodeSetUserData";
    }
    else {
      uVar8 = CVodeSetMaxNumSteps(local_90,2000);
      if ((int)uVar8 < 0) {
        pcVar14 = "CVodeSetMaxNumSteps";
      }
      else {
        uVar8 = CVodeInit(0,local_90,f,y);
        if ((int)uVar8 < 0) {
          pcVar14 = "CVodeInit";
        }
        else {
          uVar8 = CVodeSStolerances(0x88e368f1,0x3f50624dd2f1a9fc,local_90);
          if ((int)uVar8 < 0) {
            pcVar14 = "CVodeSStolerances";
          }
          else {
            local_80 = (double)CONCAT44(local_80._4_4_,unaff_R12D);
            lVar18 = SUNLinSol_SPGMR(y,1,0);
            if (lVar18 == 0) {
              main_cold_4();
              return 1;
            }
            uVar8 = CVodeSetLinearSolver(local_90,lVar18,0);
            if ((int)uVar8 < 0) {
              pcVar14 = "CVodeSetLinearSolver";
            }
            else {
              uVar8 = CVodeSetPreconditioner(local_90,Precond,PSolve);
              if ((int)uVar8 < 0) {
                pcVar14 = "CVodeSetPreconditioner";
              }
              else {
                puts("\n2-species diurnal advection-diffusion problem");
                local_74 = iVar17;
                local_4c = iVar5;
                local_40 = lVar18;
                if (local_84 == 0) {
                  __ptr = (void *)0x0;
                  pcVar14 = "Sensitivity: NO ";
                  local_68 = (undefined8 *)0x0;
                  uS = (N_Vector *)0x0;
LAB_00102bc7:
                  printf(pcVar14);
                  puts("\n");
                  puts("========================================================================");
                  puts("     T     Q       H      NST                    Bottom left  Top right ");
                  puts("========================================================================");
                  dVar20 = 7200.0;
                  iVar17 = 0xc;
                  do {
                    local_58 = dVar20;
                    uVar8 = CVode(local_90,y,&local_38,1);
                    if ((int)uVar8 < 0) {
                      pcVar14 = "CVode";
LAB_00102e6d:
                      fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n",pcVar14,
                              (ulong)uVar8);
                      break;
                    }
                    PrintOutput(local_90,local_38,y);
                    if (local_84 != 0) {
                      uVar8 = CVodeGetSens(local_90,&local_38,uS);
                      if ((int)uVar8 < 0) {
                        pcVar14 = "CVodeGetSens";
                        goto LAB_00102e6d;
                      }
                      PrintOutputS(uS);
                    }
                    puts("------------------------------------------------------------------------")
                    ;
                    dVar20 = local_58 + 7200.0;
                    iVar17 = iVar17 + -1;
                  } while (iVar17 != 0);
                  PrintFinalStats(local_90,local_4c,local_74,local_80._0_4_);
                  N_VDestroy(y);
                  if (local_84 != 0) {
                    N_VDestroyVectorArray(uS,2);
                    free(__ptr);
                    free(local_68);
                  }
                  FreeUserData(local_60);
                  CVodeFree(&local_90);
                  SUNLinSolFree(local_40);
                  SUNContext_Free(&local_70);
                  return 0;
                }
                puVar13 = (undefined8 *)malloc(8);
                if (puVar13 == (undefined8 *)0x0) {
                  main_cold_3();
                  return 1;
                }
                *puVar13 = 0x100000000;
                __ptr = malloc(0x10);
                if (__ptr == (void *)0x0) {
                  main_cold_2();
                  return 1;
                }
                psVar11 = paVar4->p;
                lVar18 = 0;
                do {
                  *(sunrealtype *)((long)__ptr + lVar18 * 8) =
                       psVar11[*(int *)((long)puVar13 + lVar18 * 4)];
                  lVar18 = lVar18 + 1;
                } while (lVar18 == 1);
                local_68 = puVar13;
                uS = (N_Vector *)N_VCloneVectorArray(2,y);
                dVar20 = local_80;
                if (uS == (N_Vector *)0x0) {
                  main_cold_1();
                  return 1;
                }
                lVar18 = 0;
                do {
                  N_VConst(0,uS[lVar18]);
                  lVar18 = lVar18 + 1;
                } while (lVar18 == 1);
                uVar8 = CVodeSensInit1(local_90,2,(ulong)dVar20 & 0xffffffff,0,uS);
                if ((int)uVar8 < 0) {
                  pcVar14 = "CVodeSensInit";
                }
                else {
                  uVar8 = CVodeSensEEtolerances(local_90);
                  if ((int)uVar8 < 0) {
                    pcVar14 = "CVodeSensEEtolerances";
                  }
                  else {
                    uVar8 = CVodeSetSensErrCon(local_90,iVar17);
                    if (-1 < (int)uVar8) {
                      uVar8 = CVodeSetSensDQMethod(0,local_90,1);
                      if ((int)uVar8 < 0) {
                        pcVar14 = "CVodeSetSensDQMethod";
                      }
                      else {
                        uVar8 = CVodeSetSensParams(local_90,local_60->p,__ptr,local_68);
                        if (-1 < (int)uVar8) {
                          printf("Sensitivity: YES ");
                          pcVar14 = "( STAGGERED1 +";
                          if (local_80._0_4_ == 2) {
                            pcVar14 = "( STAGGERED +";
                          }
                          __format = "( SIMULTANEOUS +";
                          if (local_80._0_4_ != 1) {
                            __format = pcVar14;
                          }
                          printf(__format);
                          pcVar14 = local_48;
                          goto LAB_00102bc7;
                        }
                        pcVar14 = "CVodeSetSensParams";
                      }
                      fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n",pcVar14,
                              (ulong)uVar8);
                      return 1;
                    }
                    pcVar14 = "CVodeSetSensErrCon";
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  fprintf(_stderr,"\nSUNDIALS_ERROR: %s() failed with retval = %d\n\n",pcVar14,(ulong)uVar8);
  return 1;
}

Assistant:

int main(int argc, char* argv[])
{
  SUNContext sunctx;
  void* cvode_mem;
  SUNLinearSolver LS;
  UserData data;
  sunrealtype abstol, reltol, t, tout;
  N_Vector y;
  int iout, retval;

  sunrealtype* pbar;
  int is, *plist;
  N_Vector* uS;
  sunbooleantype sensi, err_con;
  int sensi_meth;

  pbar      = NULL;
  plist     = NULL;
  uS        = NULL;
  y         = NULL;
  data      = NULL;
  cvode_mem = NULL;
  LS        = NULL;

  /* Process arguments */
  ProcessArgs(argc, argv, &sensi, &sensi_meth, &err_con);

  /* Problem parameters */
  data = AllocUserData();
  if (check_retval((void*)data, "AllocUserData", 2)) { return (1); }
  InitUserData(data);

  /* Create the SUNDIALS simulation context that all SUNDIALS objects require */
  retval = SUNContext_Create(SUN_COMM_NULL, &sunctx);
  if (check_retval(&retval, "SUNContext_Create", 1)) { return (1); }

  /* Initial states */
  y = N_VNew_Serial(NEQ, sunctx);
  if (check_retval((void*)y, "N_VNew_Serial", 0)) { return (1); }
  SetInitialProfiles(y, data->dx, data->dz);

  /* Tolerances */
  abstol = ATOL;
  reltol = RTOL;

  /* Create CVODES object */
  cvode_mem = CVodeCreate(CV_BDF, sunctx);
  if (check_retval((void*)cvode_mem, "CVodeCreate", 0)) { return (1); }

  retval = CVodeSetUserData(cvode_mem, data);
  if (check_retval(&retval, "CVodeSetUserData", 1)) { return (1); }

  retval = CVodeSetMaxNumSteps(cvode_mem, 2000);
  if (check_retval(&retval, "CVodeSetMaxNumSteps", 1)) { return (1); }

  /* Allocate CVODES memory */
  retval = CVodeInit(cvode_mem, f, T0, y);
  if (check_retval(&retval, "CVodeInit", 1)) { return (1); }

  retval = CVodeSStolerances(cvode_mem, reltol, abstol);
  if (check_retval(&retval, "CVodeSStolerances", 1)) { return (1); }

  /* Create the SUNLinSol_SPGMR linear solver with left
     preconditioning and the default Krylov dimension */
  LS = SUNLinSol_SPGMR(y, SUN_PREC_LEFT, 0, sunctx);
  if (check_retval((void*)LS, "SUNLinSol_SPGMR", 0)) { return (1); }

  /* Attach the linear sovler */
  retval = CVodeSetLinearSolver(cvode_mem, LS, NULL);
  if (check_retval(&retval, "CVodeSetLinearSolver", 1)) { return 1; }

  /* Set the preconditioner solve and setup functions */
  retval = CVodeSetPreconditioner(cvode_mem, Precond, PSolve);
  if (check_retval(&retval, "CVodeSetPreconditioner", 1)) { return (1); }

  printf("\n2-species diurnal advection-diffusion problem\n");

  /* Forward sensitivity analysis */
  if (sensi)
  {
    plist = (int*)malloc(NS * sizeof(int));
    if (check_retval((void*)plist, "malloc", 2)) { return (1); }
    for (is = 0; is < NS; is++) { plist[is] = is; }

    pbar = (sunrealtype*)malloc(NS * sizeof(sunrealtype));
    if (check_retval((void*)pbar, "malloc", 2)) { return (1); }
    for (is = 0; is < NS; is++) { pbar[is] = data->p[plist[is]]; }

    uS = N_VCloneVectorArray(NS, y);
    if (check_retval((void*)uS, "N_VCloneVectorArray", 0)) { return (1); }
    for (is = 0; is < NS; is++) { N_VConst(ZERO, uS[is]); }

    retval = CVodeSensInit1(cvode_mem, NS, sensi_meth, NULL, uS);
    if (check_retval(&retval, "CVodeSensInit", 1)) { return (1); }

    retval = CVodeSensEEtolerances(cvode_mem);
    if (check_retval(&retval, "CVodeSensEEtolerances", 1)) { return (1); }

    retval = CVodeSetSensErrCon(cvode_mem, err_con);
    if (check_retval(&retval, "CVodeSetSensErrCon", 1)) { return (1); }

    retval = CVodeSetSensDQMethod(cvode_mem, CV_CENTERED, ZERO);
    if (check_retval(&retval, "CVodeSetSensDQMethod", 1)) { return (1); }

    retval = CVodeSetSensParams(cvode_mem, data->p, pbar, plist);
    if (check_retval(&retval, "CVodeSetSensParams", 1)) { return (1); }

    printf("Sensitivity: YES ");
    if (sensi_meth == CV_SIMULTANEOUS) { printf("( SIMULTANEOUS +"); }
    else if (sensi_meth == CV_STAGGERED) { printf("( STAGGERED +"); }
    else { printf("( STAGGERED1 +"); }
    if (err_con) { printf(" FULL ERROR CONTROL )"); }
    else { printf(" PARTIAL ERROR CONTROL )"); }
  }
  else { printf("Sensitivity: NO "); }

  /* In loop over output points, call CVode, print results, test for error */

  printf("\n\n");
  printf("====================================================================="
         "===\n");
  printf("     T     Q       H      NST                    Bottom left  Top "
         "right \n");
  printf("====================================================================="
         "===\n");

  for (iout = 1, tout = TWOHR; iout <= NOUT; iout++, tout += TWOHR)
  {
    retval = CVode(cvode_mem, tout, y, &t, CV_NORMAL);
    if (check_retval(&retval, "CVode", 1)) { break; }
    PrintOutput(cvode_mem, t, y);
    if (sensi)
    {
      retval = CVodeGetSens(cvode_mem, &t, uS);
      if (check_retval(&retval, "CVodeGetSens", 1)) { break; }
      PrintOutputS(uS);
    }

    printf("-------------------------------------------------------------------"
           "-----\n");
  }

  /* Print final statistics */
  PrintFinalStats(cvode_mem, sensi, err_con, sensi_meth);

  /* Free memory */
  N_VDestroy(y);
  if (sensi)
  {
    N_VDestroyVectorArray(uS, NS);
    free(pbar);
    free(plist);
  }
  FreeUserData(data);
  CVodeFree(&cvode_mem);
  SUNLinSolFree(LS);
  SUNContext_Free(&sunctx);

  return (0);
}